

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_timeval(void)

{
  char cVar1;
  bson_t *pbVar2;
  undefined8 uVar3;
  char *pcVar4;
  timeval tv;
  bson_iter_t iter;
  long local_110;
  long local_108;
  undefined1 local_100 [232];
  
  pbVar2 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/test26.bson"
                   );
  if (pbVar2 == (bson_t *)0x0) {
    pcVar4 = "b";
    uVar3 = 0xb9;
  }
  else {
    cVar1 = bson_iter_init(local_100,pbVar2);
    if (cVar1 == '\0') {
      pcVar4 = "bson_iter_init (&iter, b)";
      uVar3 = 0xbb;
    }
    else {
      cVar1 = bson_iter_next(local_100);
      if (cVar1 == '\0') {
        pcVar4 = "bson_iter_next (&iter)";
        uVar3 = 0xbc;
      }
      else {
        bson_iter_timeval(local_100,&local_110);
        if (local_110 == 0x499602d2) {
          if (local_108 == 0) {
            bson_destroy(pbVar2);
            return;
          }
          pcVar4 = "tv.tv_usec == 0";
          uVar3 = 0xbf;
        }
        else {
          pcVar4 = "tv.tv_sec == 1234567890";
          uVar3 = 0xbe;
        }
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
          uVar3,"test_bson_iter_timeval",pcVar4);
  abort();
}

Assistant:

static void
test_bson_iter_timeval (void)
{
   bson_iter_t iter;
   bson_t *b;
   struct timeval tv;

   b = get_bson (BINARY_DIR "/test26.bson");
   BSON_ASSERT (b);

   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_next (&iter));
   bson_iter_timeval (&iter, &tv);
   BSON_ASSERT (tv.tv_sec == 1234567890);
   BSON_ASSERT (tv.tv_usec == 0);

   bson_destroy (b);
}